

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

boundaries __thiscall fmt::v7::detail::fp::assign_float_with_boundaries<double>(fp *this,double d)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong in_R10;
  boundaries bVar7;
  
  uVar2 = (ulong)d & 0xfffffffffffff;
  this->f = uVar2;
  uVar3 = (uint)((ulong)d >> 0x34) & 0x7ff;
  if (uVar3 == 0) {
    iVar6 = -0x432;
  }
  else {
    uVar2 = uVar2 | 0x10000000000000;
    this->f = uVar2;
    iVar6 = uVar3 - 0x433;
    in_R10 = 0x10000000L << (0x81U - (char)uVar3 & 0x3f);
    if (0x380 < uVar3) {
      in_R10 = 0x10000000;
    }
  }
  this->e = iVar6;
  uVar4 = uVar2 + in_R10;
  iVar5 = iVar6;
  if ((uVar4 & 0x10000000000000) == 0) {
    lVar1 = 0x3f;
    if ((uVar4 & 0xfffffffffffff) != 0) {
      for (; (uVar4 & 0xfffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar4 = uVar4 << (~(byte)lVar1 + 0x35 & 0x3f);
    iVar5 = (iVar6 + 0xb) - ((uint)lVar1 ^ 0x3f);
  }
  bVar7.upper = uVar4 << 0xb;
  bVar7.lower = uVar2 - (in_R10 >> (-0xb2 < iVar6 && uVar2 == 0x10000000000000)) <<
                (((char)iVar6 + '\v') - (char)iVar5 & 0x3fU);
  return bVar7;
}

Assistant:

boundaries assign_float_with_boundaries(Double d) {
    assign(d);
    constexpr int min_normal_e = std::numeric_limits<float>::min_exponent -
                                 std::numeric_limits<double>::digits;
    significand_type half_ulp = 1 << (std::numeric_limits<double>::digits -
                                      std::numeric_limits<float>::digits - 1);
    if (min_normal_e > e) half_ulp <<= min_normal_e - e;
    fp upper = normalize<0>(fp(f + half_ulp, e));
    fp lower = fp(
        f - (half_ulp >> ((f == implicit_bit && e > min_normal_e) ? 1 : 0)), e);
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }